

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PoolingLayerParams_ValidCompletePadding::
PoolingLayerParams_ValidCompletePadding
          (PoolingLayerParams_ValidCompletePadding *this,
          PoolingLayerParams_ValidCompletePadding *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__PoolingLayerParams_ValidCompletePadding_007004a8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->paddingamounts_).current_size_ = 0;
  (this->paddingamounts_).total_size_ = 0;
  (this->paddingamounts_).rep_ = (Rep *)0x0;
  new_size = (from->paddingamounts_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->paddingamounts_,new_size);
    memcpy(((this->paddingamounts_).rep_)->elements,((from->paddingamounts_).rep_)->elements,
           (long)(from->paddingamounts_).current_size_ << 3);
    (this->paddingamounts_).current_size_ = (from->paddingamounts_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

PoolingLayerParams_ValidCompletePadding::PoolingLayerParams_ValidCompletePadding(const PoolingLayerParams_ValidCompletePadding& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      paddingamounts_(from.paddingamounts_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PoolingLayerParams.ValidCompletePadding)
}